

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult *
iuutil::CmpHelperIsNan<int>(AssertionResult *__return_storage_ptr__,char *actual_str,int *actual)

{
  bool bVar1;
  AssertionResult *pAVar2;
  AssertionResult local_50;
  floating_point<float> local_24;
  int *local_20;
  int *actual_local;
  char *actual_str_local;
  
  local_20 = actual;
  actual_local = (int *)actual_str;
  actual_str_local = (char *)__return_storage_ptr__;
  floationg_point_helper::CastToFloatingPoint<int>((floationg_point_helper *)&local_24,actual);
  bVar1 = iutest::floating_point<float>::is_nan(&local_24);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_50,(char (*) [18])"error: Value of: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&actual_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])0x544e98);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,local_20);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [15])"\nExpected: NaN");
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    iutest::AssertionResult::~AssertionResult(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperIsNan(const char* actual_str, const T& actual)
{
    if( floationg_point_helper::CastToFloatingPoint(actual).is_nan() )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << actual_str
        << "\n  Actual: " << actual << "\nExpected: NaN";
}